

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus DecodeRUSBitpInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint local_38;
  DecodeStatus S;
  uint Op2;
  uint Op1;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  _Op2 = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  DVar1 = Decode2OpInstruction(Insn,&S,&local_38);
  if (DVar1 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass(pMStack_18,S,(uint64_t)Decoder_local,_Op2);
    DecodeBitpOperand(pMStack_18,local_38,(uint64_t)Decoder_local,_Op2);
    Inst_local._4_4_ = MCDisassembler_Success;
  }
  else {
    Inst_local._4_4_ =
         Decode2OpInstructionFail(pMStack_18,Address_local._4_4_,(uint64_t)Decoder_local,_Op2);
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeRUSBitpInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		void *Decoder)
{
	unsigned Op1, Op2;
	DecodeStatus S = Decode2OpInstruction(Insn, &Op1, &Op2);
	if (S != MCDisassembler_Success)
		return Decode2OpInstructionFail(Inst, Insn, Address, Decoder);

	DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
	DecodeBitpOperand(Inst, Op2, Address, Decoder);

	return S;
}